

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

int get_cdef_row_next_job(AV1CdefSync *cdef_sync,int *cur_fbr,int nvfb)

{
  int in_EDX;
  int *in_RSI;
  AV1CdefSync *in_RDI;
  int do_next_row;
  int local_18;
  
  pthread_mutex_lock((pthread_mutex_t *)in_RDI->mutex_);
  local_18 = 0;
  if (((in_RDI->cdef_mt_exit & 1U) == 0) && (in_RDI->end_of_frame == 0)) {
    local_18 = 1;
    *in_RSI = in_RDI->fbr;
    update_cdef_row_next_job_info(in_RDI,in_EDX);
  }
  pthread_mutex_unlock((pthread_mutex_t *)in_RDI->mutex_);
  return local_18;
}

Assistant:

static inline int get_cdef_row_next_job(AV1CdefSync *const cdef_sync,
                                        volatile int *cur_fbr, const int nvfb) {
#if CONFIG_MULTITHREAD
  pthread_mutex_lock(cdef_sync->mutex_);
#endif  // CONFIG_MULTITHREAD
  int do_next_row = 0;
  // Populates information needed for current job and update the row
  // index of the next row to be processed.
  if (!cdef_sync->cdef_mt_exit && cdef_sync->end_of_frame == 0) {
    do_next_row = 1;
    *cur_fbr = cdef_sync->fbr;
    update_cdef_row_next_job_info(cdef_sync, nvfb);
  }
#if CONFIG_MULTITHREAD
  pthread_mutex_unlock(cdef_sync->mutex_);
#endif  // CONFIG_MULTITHREAD
  return do_next_row;
}